

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O3

double ps_config_float(ps_config_t *config,char *name)

{
  cmd_ln_val_t *pcVar1;
  void *pvVar2;
  
  pcVar1 = cmd_ln_access_r(config,name);
  pvVar2 = (void *)0x0;
  if (pcVar1 != (cmd_ln_val_t *)0x0) {
    if ((pcVar1->type & 4) == 0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
              ,0x24f,"Argument %s does not have floating-point type\n",name);
      pvVar2 = (void *)0x0;
    }
    else {
      pvVar2 = (pcVar1->val).ptr;
    }
  }
  return (double)pvVar2;
}

Assistant:

double
ps_config_float(ps_config_t *config, char const *name)
{
    cmd_ln_val_t *val;
    val = cmd_ln_access_r(config, name);
    if (val == NULL)
        return 0.0;
    if (!(val->type & ARG_FLOATING)) {
        E_ERROR("Argument %s does not have floating-point type\n", name);
        return 0.0;
    }
    return val->val.fl;
}